

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<char_const(&)[2],char&,char_const(&)[3],kj::String&>
          (String *__return_storage_ptr__,kj *this,char (*params) [2],char *params_1,
          char (*params_2) [3],String *params_3)

{
  char (*value) [2];
  char *value_00;
  char (*value_01) [3];
  String *value_02;
  ArrayPtr<const_char> local_68;
  ArrayPtr<const_char> local_58;
  char local_41 [1];
  ArrayPtr<const_char> local_40;
  String *local_30;
  String *params_local_3;
  char (*params_local_2) [3];
  char *params_local_1;
  char (*params_local) [2];
  
  local_30 = (String *)params_2;
  params_local_3 = (String *)params_1;
  params_local_2 = (char (*) [3])params;
  params_local_1 = (char *)this;
  params_local = (char (*) [2])__return_storage_ptr__;
  value = ::const((char (*) [2])this);
  local_40 = toCharSequence<char_const(&)[2]>(value);
  value_00 = fwd<char&>(*params_local_2);
  local_41[0] = (char)toCharSequence<char&>(value_00);
  value_01 = ::const((char (*) [3])params_local_3);
  local_58 = toCharSequence<char_const(&)[3]>(value_01);
  value_02 = fwd<kj::String&>(local_30);
  local_68 = toCharSequence<kj::String&>(value_02);
  _::
  concat<kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_40,(ArrayPtr<const_char> *)local_41,
             (FixedArray<char,_1UL> *)&local_58,&local_68,(ArrayPtr<const_char> *)params_3);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}